

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O1

bool_t priNextPrime(word *p,word *a,size_t n,size_t trials,size_t base_count,size_t iter,void *stack
                   )

{
  bool bVar1;
  bool_t bVar2;
  size_t sVar3;
  word wVar4;
  size_t sVar5;
  long lVar6;
  size_t count;
  ulong uVar7;
  bool bVar8;
  word *mods;
  bool_t local_50;
  
  sVar3 = wwBitSize(a,n);
  if (sVar3 < 2) {
LAB_0014a3db:
    local_50 = 0;
  }
  else {
    wwCopy(p,a,n);
    uVar7 = *p;
    *p = uVar7 | 1;
    count = base_count;
    if (base_count != 0 && n == 1) {
      do {
        if (*(ulong *)(&DAT_00155d38 + count * 8) < (uVar7 | 1)) goto LAB_0014a446;
        count = count - 1;
      } while (count != 0);
      count = 0;
    }
LAB_0014a446:
    priBaseMod((word *)stack,p,n,count);
    bVar1 = true;
    if (count != 0) {
      sVar5 = 0;
      do {
        if (*(long *)((long)stack + sVar5 * 8) == 0) {
          bVar1 = false;
          break;
        }
        sVar5 = sVar5 + 1;
      } while (count != sVar5);
    }
    while( true ) {
      if (trials == 0xffffffffffffffff) {
        trials = 0xffffffffffffffff;
      }
      else {
        bVar8 = trials == 0;
        trials = trials - 1;
        if (bVar8) goto LAB_0014a3db;
      }
      if ((bVar1) &&
         (bVar2 = priRMTest(p,n,iter,(void *)(base_count * 8 + (long)stack)), bVar2 != 0)) break;
      wVar4 = zzAddW2(p,n,2);
      if (wVar4 != 0) {
        return 0;
      }
      sVar5 = wwBitSize(p,n);
      if (sVar3 < sVar5) {
        return 0;
      }
      bVar1 = true;
      if (count != 0) {
        lVar6 = 0;
        sVar5 = count;
        do {
          uVar7 = *(ulong *)((long)stack + lVar6);
          if (uVar7 < *(long *)((long)_base + lVar6) - 2U) {
            uVar7 = uVar7 + 2;
          }
          else {
            bVar8 = uVar7 == *(long *)((long)_base + lVar6) - 1U;
            uVar7 = (ulong)bVar8;
            if (!bVar8) {
              bVar1 = false;
            }
          }
          *(ulong *)((long)stack + lVar6) = uVar7;
          lVar6 = lVar6 + 8;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
    }
    local_50 = 1;
  }
  return local_50;
}

Assistant:

bool_t priNextPrime(word p[], const word a[], size_t n, size_t trials,
	size_t base_count, size_t iter, void* stack)
{
	size_t l;
	size_t i;
	bool_t base_success;
	// переменные в stack
	word* mods;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, p, n));
	ASSERT(base_count <= priBaseSize());
	// раскладка stack
	mods = (word*)stack;
	stack = mods + base_count;
	// l <- битовая длина a
	l = wwBitSize(a, n);
	// 0-битовых и 1-битовых простых не существует
	if (l <= 1)
		return FALSE;
	// p <- минимальное нечетное >= a
	wwCopy(p, a, n);
	p[0] |= 1;
	// малое p?
	if (n == 1)
		// при необходимости скорректировать факторную базу
		while (base_count > 0 && priBasePrime(base_count - 1) >= p[0])
			--base_count;
	// рассчитать остатки от деления на малые простые
	priBaseMod(mods, p, n, base_count);
	for (i = 0, base_success = TRUE; i < base_count; ++i)
		if (mods[i] == 0)
		{
			base_success = FALSE;
			break;
		}
	// попытки
	while (trials == SIZE_MAX || trials--)
	{
		// проверка простоты
		if (base_success && priRMTest(p, n, iter, stack))
			return TRUE;
		// к следующему кандидату
		if (zzAddW2(p, n, 2) || wwBitSize(p, n) > l)
			return FALSE;
		for (i = 0, base_success = TRUE; i < base_count; ++i)
		{
			if (mods[i] < _base[i] - 2)
				mods[i] += 2;
			else if (mods[i] == _base[i] - 1)
				mods[i] = 1;
			else
				mods[i] = 0, base_success = FALSE;
		}
	}
	return FALSE;
}